

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void __thiscall BailOutInfo::Clear(BailOutInfo *this,JitArenaAllocator *allocator)

{
  CapturedValues *pCVar1;
  CapturedValues *pCVar2;
  Type pSVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  code *pcVar5;
  CapturedValues *pCVar6;
  Type pSVar7;
  bool bVar8;
  uint uVar9;
  undefined4 *puVar10;
  
  if (this->bailOutRecord != (BailOutRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar10 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                       ,0x60,
                       "(bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind))"
                       ,
                       "bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind)"
                      );
    if (!bVar8) goto LAB_003fc179;
    *puVar10 = 0;
  }
  if ((this->capturedValues != (CapturedValues *)0x0) &&
     (uVar9 = CapturedValues::DecrementRefCount(this->capturedValues), uVar9 == 0)) {
    pCVar1 = this->capturedValues;
    pCVar6 = (CapturedValues *)
             (pCVar1->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
    while (pCVar6 != pCVar1) {
      pCVar2 = (CapturedValues *)
               (pCVar6->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
                 pCVar6,0x20);
      pCVar6 = pCVar2;
    }
    (pCVar1->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pCVar1;
    (pCVar1->constantValues).super_RealCount.count = 0;
    pCVar1 = this->capturedValues;
    pSVar7 = (pCVar1->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next;
    while ((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)pSVar7 != &pCVar1->copyPropSyms) {
      pSVar3 = pSVar7->next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
                 pSVar7,0x18);
      pSVar7 = pSVar3;
    }
    (pCVar1->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next =
         &(pCVar1->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
    (pCVar1->copyPropSyms).super_RealCount.count = 0;
    pBVar4 = this->capturedValues->argObjSyms;
    if (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (allocator,pBVar4);
    }
    pCVar1 = this->capturedValues;
    CapturedValues::~CapturedValues(pCVar1);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
               pCVar1,0x30);
  }
  if (this->usedCapturedValues != (CapturedValues *)0x0) {
    if (this->usedCapturedValues->refCount != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x70,"(this->usedCapturedValues->refCount == 0)",
                         "this->usedCapturedValues->refCount == 0");
      if (!bVar8) goto LAB_003fc179;
      *puVar10 = 0;
    }
    pCVar1 = this->usedCapturedValues;
    pCVar6 = (CapturedValues *)
             (pCVar1->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
    while (pCVar6 != pCVar1) {
      pCVar2 = (CapturedValues *)
               (pCVar6->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
                 pCVar6,0x20);
      pCVar6 = pCVar2;
    }
    (pCVar1->constantValues).super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pCVar1;
    (pCVar1->constantValues).super_RealCount.count = 0;
    pCVar1 = this->usedCapturedValues;
    pSVar7 = (pCVar1->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next;
    while ((SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
            *)pSVar7 != &pCVar1->copyPropSyms) {
      pSVar3 = pSVar7->next;
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
                 pSVar7,0x18);
      pSVar7 = pSVar3;
    }
    (pCVar1->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>.next =
         &(pCVar1->copyPropSyms).super_SListNodeBase<Memory::ArenaAllocator>;
    (pCVar1->copyPropSyms).super_RealCount.count = 0;
    pBVar4 = this->usedCapturedValues->argObjSyms;
    if (pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      Memory::
      DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                (allocator,pBVar4);
    }
    pCVar1 = this->usedCapturedValues;
    CapturedValues::~CapturedValues(pCVar1);
    Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
              ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)allocator,
               pCVar1,0x30);
  }
  if (this->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->byteCodeUpwardExposedUsed);
  }
  if (this->startCallInfo != (StartCallInfo *)0x0) {
    if (this->argOutSyms == (StackSym **)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                         ,0x82,"(argOutSyms)","argOutSyms");
      if (!bVar8) {
LAB_003fc179:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar10 = 0;
    }
    Memory::DeleteArray<Memory::JitArenaAllocator,unsigned_int>
              (allocator,(ulong)this->startCallCount,this->startCallInfo);
    Memory::DeleteArray<Memory::JitArenaAllocator,StackSym*>
              (allocator,(ulong)this->totalOutParamCount,this->argOutSyms);
  }
  if (this->liveVarSyms != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->liveVarSyms);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->liveLosslessInt32Syms);
    Memory::
    DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
              (allocator,this->liveFloat64Syms);
    return;
  }
  return;
}

Assistant:

void
BailOutInfo::Clear(JitArenaAllocator * allocator)
{
    // Previously, we don't have a case where we delete bailout info after we allocated the bailout record.
    // However, since lazy bailouts can now be attached on helper call instructions, and those instructions
    // might sometimes be removed in Peeps, we will hit those cases. Make sure that in such cases, lazy bailout
    // is the only bailout reason we have.
    Assert(bailOutRecord == nullptr || BailOutInfo::OnlyHasLazyBailOut(bailOutRecord->bailOutKind));
    if (this->capturedValues && this->capturedValues->DecrementRefCount() == 0)
    {
        this->capturedValues->constantValues.Clear(allocator);
        this->capturedValues->copyPropSyms.Clear(allocator);

        if (this->capturedValues->argObjSyms)
        {
            JitAdelete(allocator, this->capturedValues->argObjSyms);
        }

        JitAdelete(allocator, this->capturedValues);
    }

    if (this->usedCapturedValues)
    {
        Assert(this->usedCapturedValues->refCount == 0);
        this->usedCapturedValues->constantValues.Clear(allocator);
        this->usedCapturedValues->copyPropSyms.Clear(allocator);

        if (this->usedCapturedValues->argObjSyms)
        {
            JitAdelete(allocator, this->usedCapturedValues->argObjSyms);
        }

        JitAdelete(allocator, this->usedCapturedValues);
    }

    if (byteCodeUpwardExposedUsed)
    {
        JitAdelete(allocator, byteCodeUpwardExposedUsed);
    }
    if (startCallInfo)
    {
        Assert(argOutSyms);
        JitAdeleteArray(allocator, startCallCount, startCallInfo);
        JitAdeleteArray(allocator, totalOutParamCount, argOutSyms);
    }
    if (liveVarSyms)
    {
        JitAdelete(allocator, liveVarSyms);
        JitAdelete(allocator, liveLosslessInt32Syms);
        JitAdelete(allocator, liveFloat64Syms);
    }
#ifdef _M_IX86
    if (outParamFrameAdjustArgSlot)
    {
        JitAdelete(allocator, outParamFrameAdjustArgSlot);
    }
#endif
}